

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(ValidationState_t *this,uint32_t id)

{
  uint32_t uVar1;
  uint32_t id_00;
  Instruction *pIVar2;
  
  pIVar2 = FindDef(this,id);
  if (pIVar2 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3d6,
                  "bool spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(uint32_t) const");
  }
  if ((pIVar2->inst_).opcode == 0x17) {
    uVar1 = GetDimension(this,id);
    id_00 = GetComponentType(this,id);
    pIVar2 = FindDef(this,id_00);
    if (((pIVar2 != (Instruction *)0x0) && ((pIVar2->inst_).opcode == 0x16)) &&
       ((uVar1 == 4 || (uVar1 == 2)))) {
      uVar1 = GetComponentType(this,id);
      uVar1 = GetBitWidth(this,uVar1);
      return uVar1 == 0x10;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsFloat16Vector2Or4Type(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t vectorDim = GetDimension(id);
    return IsFloatScalarType(GetComponentType(id)) &&
           (vectorDim == 2 || vectorDim == 4) &&
           (GetBitWidth(GetComponentType(id)) == 16);
  }

  return false;
}